

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O1

void duckdb::MedianAbsoluteDeviationOperation<long>::
     Finalize<long,duckdb::QuantileState<long,duckdb::QuantileStandardType>>
               (QuantileState<long,_duckdb::QuantileStandardType> *state,long *target,
               AggregateFinalizeData *finalize_data)

{
  AggregateInputData *this;
  long *v_t;
  reference pvVar1;
  long lVar2;
  idx_t iVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  MadAccessor<long,_long,_long> accessor;
  long med;
  Interpolator<false> interp;
  MadAccessor<long,_long,_long> local_70;
  long local_68;
  Interpolator<false> local_60;
  
  if ((state->v).super_vector<long,_std::allocator<long>_>.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
      (state->v).super_vector<long,_std::allocator<long>_>.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pvVar1 = vector<duckdb::QuantileValue,_true>::operator[]
                       ((vector<duckdb::QuantileValue,_true> *)((this->bind_data).ptr + 8),0);
    v_t = (state->v).super_vector<long,_std::allocator<long>_>.
          super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    iVar3 = (long)(state->v).super_vector<long,_std::allocator<long>_>.
                  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                  _M_finish - (long)v_t >> 3;
    local_60.desc = false;
    lVar2 = iVar3 - 1;
    auVar6._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar6._0_8_ = lVar2;
    auVar6._12_4_ = 0x45300000;
    dVar4 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) * pvVar1->dbl;
    local_60.RN = dVar4;
    dVar5 = floor(dVar4);
    local_60.FRN = (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5;
    dVar4 = ceil(dVar4);
    local_60.CRN = (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4;
    local_60.begin = 0;
    local_60.end = iVar3;
    local_68 = Interpolator<false>::Operation<long,long,duckdb::QuantileDirect<long>>
                         (&local_60,v_t,finalize_data->result,(QuantileDirect<long> *)&local_68);
    local_70.median = &local_68;
    lVar2 = Interpolator<false>::Operation<long,long,duckdb::MadAccessor<long,long,long>>
                      (&local_60,
                       (state->v).super_vector<long,_std::allocator<long>_>.
                       super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start,finalize_data->result,&local_70);
    *target = lVar2;
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}
		using INPUT_TYPE = typename STATE::InputType;
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		const auto &q = bind_data.quantiles[0];
		Interpolator<false> interp(q, state.v.size(), false);
		const auto med = interp.template Operation<INPUT_TYPE, MEDIAN_TYPE>(state.v.data(), finalize_data.result);

		MadAccessor<INPUT_TYPE, T, MEDIAN_TYPE> accessor(med);
		target = interp.template Operation<INPUT_TYPE, T>(state.v.data(), finalize_data.result, accessor);
	}